

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_binary_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  byte local_b1;
  bool local_a5;
  string local_98;
  string local_78;
  string local_58;
  byte local_31;
  ID local_30;
  bool forward;
  char *pcStack_28;
  bool force_temporary_precise;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerGLSL *this_local;
  
  local_a5 = false;
  pcStack_28 = op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  if (((this->backend).support_precise_qualifier & 1U) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_30,result_id);
    bVar1 = Compiler::has_decoration(&this->super_Compiler,local_30,DecorationNoContraction);
    local_a5 = false;
    if (bVar1) {
      type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,op0_local);
      local_a5 = type_is_floating_point(type);
    }
  }
  forward = local_a5;
  bVar1 = should_forward(this,op_local._4_4_);
  local_b1 = 0;
  if (bVar1) {
    bVar1 = should_forward(this,(uint32_t)op_local);
    local_b1 = 0;
    if (bVar1) {
      local_b1 = forward ^ 0xff;
    }
  }
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  local_31 = local_b1 & 1;
  to_enclosed_unpacked_expression_abi_cxx11_(&local_78,this,op_local._4_4_,true);
  to_enclosed_unpacked_expression_abi_cxx11_(&local_98,this,(uint32_t)op_local,true);
  join<std::__cxx11::string,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string>
            (&local_58,(spirv_cross *)&local_78,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
             (char (*) [2])&stack0xffffffffffffffd8,(char **)0x645fd9,(char (*) [2])&local_98,
             in_stack_ffffffffffffff38);
  emit_op(this,result_type_00,result_id_00,&local_58,(bool)(local_31 & 1),false);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_78);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,op_local._4_4_);
  Compiler::inherit_expression_dependencies(&this->super_Compiler,op1_local,(uint32_t)op_local);
  return;
}

Assistant:

void CompilerGLSL::emit_binary_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1, const char *op)
{
	// Various FP arithmetic opcodes such as add, sub, mul will hit this.
	bool force_temporary_precise = backend.support_precise_qualifier &&
	                               has_decoration(result_id, DecorationNoContraction) &&
	                               type_is_floating_point(get<SPIRType>(result_type));
	bool forward = should_forward(op0) && should_forward(op1) && !force_temporary_precise;

	emit_op(result_type, result_id,
	        join(to_enclosed_unpacked_expression(op0), " ", op, " ", to_enclosed_unpacked_expression(op1)), forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}